

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O1

void __thiscall ObjectFileDB::get_objs_from_dgo(ObjectFileDB *this,string *filename)

{
  ulong uVar1;
  lzo_uint lVar2;
  pointer puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  string *psVar11;
  uint uVar12;
  ulong uVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dgo_data;
  string local_108;
  string *local_e8;
  ObjectFileDB *local_e0;
  DgoHeader header;
  string dgo_base_name;
  lzo_uint bytes_written;
  lzo_uint lStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  read_binary_file(&dgo_data,filename);
  (this->stats).total_dgo_bytes =
       (this->stats).total_dgo_bytes +
       ((uint)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (int)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start);
  local_e0 = this;
  if (*(int *)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0x426c5a6f) {
    iVar4 = __lzo_init_v2(0x20a0,2,4,8,4,8,8,8,8,0x30);
    puVar3 = dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar4 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                    ,0x59,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
    }
    uVar12 = (uint)((ulong)(uint)dgo_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                   (long)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
    local_e8 = filename;
    if (uVar12 < 4) {
LAB_0012021f:
      __assert_fail("seek <= size",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/BinaryReader.h"
                    ,0x1a,"void BinaryReader::ffwd(int)");
    }
    uVar6 = (ulong)(uint)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
            (long)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start & 0xffffffff;
    if (uVar6 < 8) {
LAB_00120200:
      pcVar8 = "T BinaryReader::read() [T = unsigned int]";
      goto LAB_00120215;
    }
    uVar10 = (ulong)*(uint *)(dgo_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4);
    header.size = 0;
    header.name[0] = '\0';
    header.name[1] = '\0';
    header.name[2] = '\0';
    header.name[3] = '\0';
    header.name[4] = '\0';
    header.name[5] = '\0';
    header.name[6] = '\0';
    header.name[7] = '\0';
    header.name[8] = '\0';
    header.name[9] = '\0';
    header.name[10] = '\0';
    header.name[0xb] = '\0';
    header.name[0xc] = '\0';
    header.name[0xd] = '\0';
    header.name[0xe] = '\0';
    header.name[0xf] = '\0';
    header.name[0x10] = '\0';
    header.name[0x11] = '\0';
    header.name[0x12] = '\0';
    header.name[0x13] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header,uVar10);
    uVar5 = 8;
    uVar13 = 0;
    do {
      do {
        uVar1 = (ulong)uVar5 + 4;
        if (uVar6 < uVar1) goto LAB_00120200;
        uVar9 = *(uint *)(puVar3 + uVar5);
        uVar5 = uVar5 + 4;
      } while ((ulong)uVar9 == 0);
      if (uVar9 < 0x8000) {
        iVar4 = lzo1x_decompress(puVar3 + (uVar1 & 0xffffffff),(ulong)uVar9,
                                 (uchar *)(header._0_8_ + uVar13),&bytes_written,(void *)0x0);
        if (iVar4 != 0) {
          __assert_fail("lzo_rv == LZO_E_OK",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                        ,0x6e,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
        }
        uVar5 = uVar9 + (int)uVar1;
        lVar2 = bytes_written;
      }
      else {
        memcpy((void *)(header._0_8_ + uVar13),puVar3 + (uVar1 & 0xffffffff),0x8000);
        uVar5 = (int)uVar1 + 0x8000;
        lVar2 = 0x8000;
      }
      if (uVar12 < uVar5) goto LAB_0012021f;
      uVar13 = lVar2 + uVar13;
      if (uVar13 < uVar10) {
        while ((uVar5 & 3) != 0) {
          uVar5 = uVar5 + 1;
          if (uVar12 < uVar5) goto LAB_0012021f;
        }
      }
    } while (uVar13 < uVar10);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&dgo_data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&header);
    filename = local_e8;
    if (header._0_8_ != 0) {
      operator_delete((void *)header._0_8_,header.name._12_8_ - header._0_8_);
    }
  }
  puVar3 = dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (uint)((ulong)(uint)dgo_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                 (long)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  uVar6 = (ulong)(uint)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
          (long)dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff;
  if (0x3f < uVar6) {
    header._0_8_ = *(undefined8 *)
                    dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    header.name._4_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 8);
    header.name._12_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10);
    header.name._20_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x18);
    header.name._28_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x20);
    header.name._36_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x28);
    header.name._44_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x30);
    header.name._52_8_ =
         *(undefined8 *)
          (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x38);
    base_name(&dgo_base_name,filename);
    psVar11 = (string *)header.name;
    iVar4 = std::__cxx11::string::compare((char *)&dgo_base_name);
    if (iVar4 != 0) {
      __assert_fail("header.name == dgo_base_name",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                    ,0x86,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
    }
    anon_unknown.dwarf_380cb::assert_string_empty_after(header.name,(int)psVar11);
    if (header.size == 0) {
      uVar5 = 0x40;
    }
    else {
      pcVar8 = (char *)((long)&bytes_written + 4);
      uVar5 = 0x40;
      uVar9 = 0;
      do {
        uVar13 = (ulong)uVar5;
        uVar10 = uVar13 + 0x40;
        if (uVar6 < uVar10) goto LAB_0012023e;
        bytes_written = *(lzo_uint *)(puVar3 + uVar13);
        lStack_70 = *(lzo_uint *)((long)(puVar3 + uVar13) + 8);
        local_68 = *(undefined8 *)(puVar3 + uVar13 + 0x10);
        uStack_60 = *(undefined8 *)(puVar3 + uVar13 + 0x10 + 8);
        local_58 = *(undefined8 *)(puVar3 + uVar13 + 0x20);
        uStack_50 = *(undefined8 *)(puVar3 + uVar13 + 0x20 + 8);
        local_48 = *(undefined8 *)(puVar3 + uVar13 + 0x30);
        uStack_40 = *(undefined8 *)(puVar3 + uVar13 + 0x30 + 8);
        if (uVar12 - (int)uVar10 < (uint)bytes_written) {
          __assert_fail("reader.bytes_left() >= obj_header.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                        ,0x8c,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
        }
        anon_unknown.dwarf_380cb::assert_string_empty_after(pcVar8,(int)psVar11);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        sVar7 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pcVar8,pcVar8 + sVar7);
        psVar11 = &local_108;
        add_obj_from_dgo(local_e0,&local_108,puVar3 + (uVar10 & 0xffffffff),(uint)bytes_written,
                         &dgo_base_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          psVar11 = (string *)(local_108.field_2._M_allocated_capacity + 1);
          operator_delete(local_108._M_dataplus._M_p,(ulong)psVar11);
        }
        uVar5 = (uint)bytes_written + (int)uVar10;
        if (uVar12 < uVar5) goto LAB_0012021f;
        uVar9 = uVar9 + 1;
      } while (uVar9 < header.size);
    }
    if (uVar5 == uVar12) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dgo_base_name._M_dataplus._M_p != &dgo_base_name.field_2) {
        operator_delete(dgo_base_name._M_dataplus._M_p,
                        dgo_base_name.field_2._M_allocated_capacity + 1);
      }
      if (dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(dgo_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)dgo_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)dgo_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    __assert_fail("0 == reader.bytes_left()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                  ,0x94,"void ObjectFileDB::get_objs_from_dgo(const std::string &)");
  }
LAB_0012023e:
  pcVar8 = "T BinaryReader::read() [T = DgoHeader]";
LAB_00120215:
  __assert_fail("seek + sizeof(T) <= size",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/BinaryReader.h"
                ,0x12,pcVar8);
}

Assistant:

void ObjectFileDB::get_objs_from_dgo(const std::string& filename) {
  auto dgo_data = read_binary_file(filename);
  stats.total_dgo_bytes += dgo_data.size();

  const char jak2_header[] = "oZlB";
  bool is_jak2 = true;
  for (int i = 0; i < 4; i++) {
    if (jak2_header[i] != dgo_data[i]) {
      is_jak2 = false;
    }
  }

  if (is_jak2) {
    if (lzo_init() != LZO_E_OK) {
      assert(false);
    }
    BinaryReader compressed_reader(dgo_data);
    // seek past oZlB
    compressed_reader.ffwd(4);
    auto decompressed_size = compressed_reader.read<uint32_t>();
    std::vector<uint8_t> decompressed_data;
    decompressed_data.resize(decompressed_size);
    size_t output_offset = 0;
    while (true) {
      // seek past alignment bytes and read the next chunk size
      uint32_t chunk_size = 0;
      while (!chunk_size) {
        chunk_size = compressed_reader.read<uint32_t>();
      }

      if (chunk_size < MAX_CHUNK_SIZE) {
        lzo_uint bytes_written;
        auto lzo_rv =
            lzo1x_decompress(compressed_reader.here(), chunk_size,
                             decompressed_data.data() + output_offset, &bytes_written, nullptr);
        assert(lzo_rv == LZO_E_OK);
        compressed_reader.ffwd(chunk_size);
        output_offset += bytes_written;
      } else {
        // nope - sometimes chunk_size is bigger than MAX, but we should still use max.
        //        assert(chunk_size == MAX_CHUNK_SIZE);
        memcpy(decompressed_data.data() + output_offset, compressed_reader.here(), MAX_CHUNK_SIZE);
        compressed_reader.ffwd(MAX_CHUNK_SIZE);
        output_offset += MAX_CHUNK_SIZE;
      }

      if (output_offset >= decompressed_size)
        break;
      while (compressed_reader.get_seek() % 4) {
        compressed_reader.ffwd(1);
      }
    }
    dgo_data = decompressed_data;
  }

  BinaryReader reader(dgo_data);
  auto header = reader.read<DgoHeader>();

  auto dgo_base_name = base_name(filename);
  assert(header.name == dgo_base_name);
  assert_string_empty_after(header.name, 60);

  // get all obj files...
  for (uint32_t i = 0; i < header.size; i++) {
    auto obj_header = reader.read<DgoHeader>();
    assert(reader.bytes_left() >= obj_header.size);
    assert_string_empty_after(obj_header.name, 60);

    add_obj_from_dgo(obj_header.name, reader.here(), obj_header.size, dgo_base_name);
    reader.ffwd(obj_header.size);
  }

  // check we're at the end
  assert(0 == reader.bytes_left());
}